

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::AsyncOutputStream>,kj::String>
          (Promise<void> *this,Own<kj::AsyncOutputStream> *attachments,String *attachments_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  AsyncOutputStream *pAVar3;
  char *pcVar4;
  size_t sVar5;
  long *in_RCX;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_> *pAVar6;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_> *extraout_RDX;
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_> *extraout_RDX_00;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String>_>_>
  OVar7;
  Promise<void> PVar8;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  Tuple<kj::Own<kj::AsyncOutputStream>,_kj::String> local_38;
  
  local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.disposer =
       (Disposer *)(attachments_1->content).ptr;
  local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr =
       (AsyncOutputStream *)(attachments_1->content).size_;
  (attachments_1->content).size_ = 0;
  local_38.impl.super_TupleElement<1U,_kj::String>.value.content.ptr = (char *)*in_RCX;
  local_38.impl.super_TupleElement<1U,_kj::String>.value.content.size_ = in_RCX[1];
  local_38.impl.super_TupleElement<1U,_kj::String>.value.content.disposer =
       (ArrayDisposer *)in_RCX[2];
  *in_RCX = 0;
  in_RCX[1] = 0;
  OVar7 = heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::String>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::String>>
                    ((kj *)&local_48,(Own<kj::_::PromiseNode> *)attachments,&local_38);
  sVar5 = local_38.impl.super_TupleElement<1U,_kj::String>.value.content.size_;
  pcVar4 = local_38.impl.super_TupleElement<1U,_kj::String>.value.content.ptr;
  pAVar6 = OVar7.ptr;
  uVar1 = (undefined4)uStack_40;
  uVar2 = uStack_40._4_4_;
  uStack_40 = 0;
  *(undefined4 *)&(this->super_PromiseBase).node.disposer = local_48;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.disposer + 4) = uStack_44;
  *(undefined4 *)&(this->super_PromiseBase).node.ptr = uVar1;
  *(undefined4 *)((long)&(this->super_PromiseBase).node.ptr + 4) = uVar2;
  if (local_38.impl.super_TupleElement<1U,_kj::String>.value.content.ptr != (char *)0x0) {
    local_38.impl.super_TupleElement<1U,_kj::String>.value.content.ptr = (char *)0x0;
    local_38.impl.super_TupleElement<1U,_kj::String>.value.content.size_ = 0;
    (**(local_38.impl.super_TupleElement<1U,_kj::String>.value.content.disposer)->
       _vptr_ArrayDisposer)
              (local_38.impl.super_TupleElement<1U,_kj::String>.value.content.disposer,pcVar4,1,
               sVar5,sVar5,0);
    pAVar6 = extraout_RDX;
  }
  pAVar3 = local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr;
  if (local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr !=
      (AsyncOutputStream *)0x0) {
    local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr =
         (AsyncOutputStream *)0x0;
    (**(local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.disposer)->
       _vptr_Disposer)(local_38.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.
                       disposer,pAVar3->_vptr_AsyncOutputStream[-2] +
                                (long)&pAVar3->_vptr_AsyncOutputStream);
    pAVar6 = extraout_RDX_00;
  }
  PVar8.super_PromiseBase.node.ptr = (PromiseNode *)pAVar6;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar8.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}